

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::append_unlocked(LogFile *this,char *logline,int len)

{
  long in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::operator->
            ((unique_ptr<AppendFile,_std::default_delete<AppendFile>_> *)0x1255e5);
  AppendFile::append((AppendFile *)CONCAT44(len,in_stack_00000010),in_stack_00000008,unaff_retaddr);
  *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) + 1;
  if (*(int *)(in_RDI + 0x20) <= *(int *)(in_RDI + 0x24)) {
    *(undefined4 *)(in_RDI + 0x24) = 0;
    std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::operator->
              ((unique_ptr<AppendFile,_std::default_delete<AppendFile>_> *)0x125622);
    AppendFile::flush((AppendFile *)0x12562a);
  }
  return;
}

Assistant:

void LogFile::append_unlocked(const char* logline, int len){
    file_->append(logline, len);
    ++count_;
    if(count_>=flushEveryN_){
        count_=0;
        file_->flush();
    }
}